

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManEquivToChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pOld;
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int Num;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar8 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555] &
          0xfffffff;
  if (uVar8 != 0xfffffff) {
    if (p->nObjs <= (int)uVar8) goto LAB_001fe495;
    if (pGVar3 != (Gia_Obj_t *)0x0) {
      pGVar3 = pGVar3 + uVar8;
      if ((~*(ulong *)pGVar3 & 0x1fffffff1fffffff) != 0) {
        Gia_ManEquivToChoices_rec(pNew,p,pGVar3);
        if (((int)(uint)*(undefined8 *)pObj < 0) ||
           (uVar5 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar5 == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x6af,
                        "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar5);
        Gia_ManEquivToChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
        uVar8 = *(ulong *)pObj;
        if ((int)pObj[-(uVar8 & 0x1fffffff)].Value < 0) goto LAB_001fe457;
        uVar5 = (uint)(uVar8 >> 0x20);
        if ((int)pObj[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_001fe457;
        uVar5 = Gia_ManHashAnd(pNew,(uint)(uVar8 >> 0x1d) & 1 ^ pObj[-(uVar8 & 0x1fffffff)].Value,
                               pObj[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
        pObj->Value = uVar5;
        if (((int)uVar5 < 0) || (uVar1 = pGVar3->Value, (int)uVar1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x133,"int Abc_LitRegular(int)");
        }
        if ((uVar1 ^ uVar5) < 2) {
          if (uVar5 == (((uint)pGVar3 & 1 ^
                        (uint)((ulong)*(undefined8 *)((ulong)pGVar3 & 0xfffffffffffffffe) >> 0x3f))
                        != ((uint)pObj & 1 ^
                           (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f))
                       ^ uVar1)) {
            return;
          }
          __assert_fail("(int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) )"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x6b5,
                        "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
        }
        if (uVar5 < uVar1) {
          return;
        }
        if (uVar5 <= uVar1) {
          __assert_fail("pRepr->Value < pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x6ba,
                        "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar2 = pNew->nObjs;
        if (((int)uVar2 <= (int)(uVar1 >> 1)) || (uVar5 = uVar5 >> 1, uVar2 <= uVar5)) {
LAB_001fe495:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar4 = pNew->pObjs;
        pOld = pGVar4 + (uVar1 >> 1);
        pGVar7 = pGVar4 + uVar5;
        uVar5 = (uint)pNew->pReprs[uVar5] & 0xfffffff;
        if (uVar5 != 0xfffffff) {
          if (uVar2 <= uVar5) goto LAB_001fe495;
          if (pGVar4 != (Gia_Obj_t *)0x0) {
            iVar6 = Gia_ObjId(pNew,pGVar7);
            pGVar7 = Gia_ObjReprObj(pNew,iVar6);
            if (pGVar7 != pOld) {
              return;
            }
            goto LAB_001fe11a;
          }
        }
        iVar6 = Gia_ObjCheckTfi(pNew,pOld,pGVar7);
        if (iVar6 == 0) {
          iVar6 = Gia_ObjId(pNew,pGVar7);
          if (pNew->pNexts[iVar6] != 0) {
            __assert_fail("Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x6c7,
                          "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar6 = Gia_ObjId(pNew,pGVar7);
          Num = Gia_ObjId(pNew,pOld);
          Gia_ObjSetRepr(pNew,iVar6,Num);
          Gia_ManAddNextEntry_rec(pNew,pOld,pGVar7);
        }
      }
LAB_001fe11a:
      if ((int)pGVar3->Value < 0) goto LAB_001fe457;
      uVar5 = pGVar3->Value ^
              (uint)(((uint)((ulong)*(undefined8 *)((ulong)pGVar3 & 0xfffffffffffffffe) >> 0x3f) ^
                     (uint)pGVar3 & 1) !=
                    ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                    (uint)pObj & 1));
      goto LAB_001fe203;
    }
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar5 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar5 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x6ce,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar5);
  Gia_ManEquivToChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
  uVar8 = *(ulong *)pObj;
  if (-1 < (int)pObj[-(uVar8 & 0x1fffffff)].Value) {
    uVar5 = (uint)(uVar8 >> 0x20);
    if (-1 < (int)pObj[-(ulong)(uVar5 & 0x1fffffff)].Value) {
      uVar5 = Gia_ManHashAnd(pNew,(uint)(uVar8 >> 0x1d) & 1 ^ pObj[-(uVar8 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
LAB_001fe203:
      pObj->Value = uVar5;
      return;
    }
  }
LAB_001fe457:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManEquivToChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr, * pReprNew, * pObjNew;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        if ( Gia_ObjIsConst0(pRepr) )
        {
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        Gia_ManEquivToChoices_rec( pNew, p, pRepr );
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Abc_LitRegular(pObj->Value) == Abc_LitRegular(pRepr->Value) )
        {
            assert( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) ) );
            return;
        }
        if ( pRepr->Value > pObj->Value ) // should never happen with high resource limit
            return;
        assert( pRepr->Value < pObj->Value );
        pReprNew = Gia_ManObj( pNew, Abc_Lit2Var(pRepr->Value) );
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) )
        {
//            assert( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) == pReprNew );
            if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) != pReprNew )
                return;
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        if ( !Gia_ObjCheckTfi( pNew, pReprNew, pObjNew ) )
        {
            assert( Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0 );
            Gia_ObjSetRepr( pNew, Gia_ObjId(pNew, pObjNew), Gia_ObjId(pNew, pReprNew) );
            Gia_ManAddNextEntry_rec( pNew, pReprNew, pObjNew );
        }
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}